

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdp.cpp
# Opt level: O3

void __thiscall despot::MDP::ComputeBlindAlpha(MDP *this)

{
  long lVar1;
  size_type __n;
  uint uVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  long lVar5;
  log_ostream *this_00;
  ostream *poVar6;
  ulong uVar7;
  double *pdVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  double extraout_XMM0_Qa;
  double dVar12;
  double extraout_XMM0_Qa_00;
  double dVar13;
  vector<double,_std::allocator<double>_> cur;
  vector<double,_std::allocator<double>_> prev;
  double local_98;
  allocator_type local_89;
  int local_88;
  int local_84;
  vector<double,_std::allocator<double>_> local_80;
  void *local_68 [2];
  long local_58;
  double local_50;
  ulong local_48;
  size_type local_40;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_38;
  
  uVar2 = (*this->_vptr_MDP[2])();
  uVar3 = (*this->_vptr_MDP[3])(this);
  local_38 = &this->blind_alpha_;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(local_38,(long)(int)uVar3);
  if (0 < (int)uVar3) {
    local_40 = (size_type)(int)uVar2;
    local_50 = INFINITY;
    local_84 = 1;
    local_88 = 3;
    local_48 = (ulong)uVar3;
    uVar11 = (ulong)uVar2;
    uVar10 = 0;
    do {
      __n = local_40;
      std::vector<double,_std::allocator<double>_>::vector
                (&local_80,local_40,(allocator_type *)local_68);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)local_68,__n,&local_89);
      if (0 < (int)uVar2) {
        uVar7 = 0;
        dVar13 = local_50;
        do {
          (*this->_vptr_MDP[5])(this,uVar7,uVar10 & 0xffffffff);
          dVar12 = extraout_XMM0_Qa;
          if (dVar13 <= extraout_XMM0_Qa) {
            dVar12 = dVar13;
          }
          uVar3 = (int)uVar7 + 1;
          uVar7 = (ulong)uVar3;
          dVar13 = dVar12;
        } while (uVar2 != uVar3);
        if (0 < (int)uVar2) {
          uVar7 = 0;
          do {
            local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar7] = dVar12 / (1.0 - DAT_00192dc8);
            uVar7 = uVar7 + 1;
          } while (uVar11 != uVar7);
        }
      }
      iVar9 = 0;
      do {
        local_98 = 0.0;
        if ((int)uVar2 < 1) {
LAB_0013e1e2:
          iVar9 = iVar9 + 1;
          goto LAB_0013e1e5;
        }
        uVar7 = 0;
        do {
          *(double *)((long)local_68[0] + uVar7 * 8) =
               local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar7];
          uVar7 = uVar7 + 1;
        } while (uVar11 != uVar7);
        if ((int)uVar2 < 1) goto LAB_0013e1e2;
        local_98 = 0.0;
        uVar7 = 0;
        do {
          local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar7] = 0.0;
          iVar4 = (*this->_vptr_MDP[4])(this,uVar7 & 0xffffffff,uVar10 & 0xffffffff);
          lVar1 = *(long *)CONCAT44(extraout_var,iVar4);
          lVar5 = ((long *)CONCAT44(extraout_var,iVar4))[1] - lVar1;
          if (lVar5 != 0) {
            lVar5 = lVar5 >> 5;
            lVar5 = lVar5 + (ulong)(lVar5 == 0);
            pdVar8 = (double *)(lVar1 + 0x18);
            do {
              if ((long)*(int *)((long)pdVar8 + -0xc) < 0) {
                __assert_fail("next.state_id >= 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/core/mdp.cpp"
                              ,0x61,"virtual void despot::MDP::ComputeBlindAlpha()");
              }
              local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar7] =
                   *pdVar8 * *(double *)
                              ((long)local_68[0] + (long)*(int *)((long)pdVar8 + -0xc) * 8) +
                   local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar7];
              pdVar8 = pdVar8 + 4;
              lVar5 = lVar5 + -1;
            } while (lVar5 != 0);
          }
          (*this->_vptr_MDP[5])(this,uVar7 & 0xffffffff,uVar10 & 0xffffffff);
          dVar13 = DAT_00192dc8 *
                   local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar7] + extraout_XMM0_Qa_00;
          local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar7] = dVar13;
          local_98 = local_98 + ABS(dVar13 - *(double *)((long)local_68[0] + uVar7 * 8));
          uVar7 = uVar7 + 1;
        } while (uVar7 != uVar11);
        if (local_98 < 0.0001) goto LAB_0013e1e2;
        iVar9 = iVar9 + 1;
      } while (iVar9 != 1000);
      iVar9 = 1000;
LAB_0013e1e5:
      iVar4 = logging::level();
      if (local_84 <= iVar4) {
        iVar4 = logging::level();
        if (local_88 <= iVar4) {
          this_00 = logging::stream(local_88);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&this_00->super_ostream,"[MDP::ComputeBlindAlpha] Tol(alpha_",0x23);
          poVar6 = (ostream *)std::ostream::operator<<(this_00,(int)uVar10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,") after ",8);
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," iters = ",9);
          poVar6 = std::ostream::_M_insert<double>(local_98);
          std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
        }
      }
      std::vector<double,_std::allocator<double>_>::operator=
                ((local_38->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + uVar10,&local_80);
      if (local_68[0] != (void *)0x0) {
        operator_delete(local_68[0],local_58 - (long)local_68[0]);
      }
      if (local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != local_48);
  }
  return;
}

Assistant:

void MDP::ComputeBlindAlpha() {
	int num_states = NumStates(), num_actions = NumActions();

	blind_alpha_.resize(num_actions);

	for (ACT_TYPE action = 0; action < num_actions; action++) {
		vector<double> cur(num_states), prev(num_states);

		double min = Globals::POS_INFTY;
		for (int s = 0; s < num_states; s++) {
			double reward = Reward(s, action);
			if (reward < min)
				min = reward;
		}

		for (int s = 0; s < num_states; s++)
			cur[s] = min / (1 - Globals::Discount());

		double tol = 0;
		int iter = 0;
		for (iter = 0; iter < 1000; iter++) {
			tol = 0;

			for (int s = 0; s < num_states; s++)
				prev[s] = cur[s];

			for (int s = 0; s < num_states; s++) {
				cur[s] = 0;
				const vector<State>& transition = TransitionProbability(s,
					action);
				for (int i = 0; i < transition.size(); i++) {
					const State& next = transition[i];
					assert(next.state_id >= 0);
					cur[s] += next.weight * prev[next.state_id];
				}
				cur[s] = Reward(s, action) + Globals::Discount() * cur[s];

				tol += abs(cur[s] - prev[s]);
			}

			if (tol < 0.0001) {
				iter++;
				break;
			}
		}
		logi << "[MDP::ComputeBlindAlpha] Tol(alpha_" << action << ") after " << iter << " iters = "
			<< tol << endl;

		blind_alpha_[action] = cur;
	}
}